

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
 __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,char,void>
::getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<4ul>>>
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
           *this)

{
  element_type *peVar1;
  undefined8 extraout_RDX;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
  *in_RDI;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
  IVar2;
  unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
  *in_stack_ffffffffffffff48;
  _Head_base<0UL,_supermap::io::InputStream_*,_false> this_00;
  string_type *__source;
  path *in_stack_ffffffffffffff80;
  string_type local_70;
  undefined1 local_50 [56];
  undefined1 local_18 [24];
  
  this_00._M_head_impl = (InputStream *)in_RDI;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
  ::getFileManager(in_RDI);
  peVar1 = std::
           __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15e54d);
  __source = &local_70;
  getStorageFilePath_abi_cxx11_
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
              *)this_00._M_head_impl);
  std::filesystem::__cxx11::path::path
            (in_stack_ffffffffffffff80,__source,(format)((ulong)peVar1 >> 0x38));
  (**peVar1->_vptr_FileManager)(local_18,peVar1,local_50,0);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
  ::InputIterator((InputIterator<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
                   *)in_RDI,in_stack_ffffffffffffff48);
  std::unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
  ~unique_ptr((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
               *)in_RDI);
  std::filesystem::__cxx11::path::~path((path *)in_RDI);
  std::__cxx11::string::~string((string *)&local_70);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x15e5dc);
  IVar2._8_8_ = extraout_RDX;
  IVar2.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )this_00._M_head_impl;
  return IVar2;
}

Assistant:

io::InputIterator<Out, IndexT> getCustomDataIterator() const {
        return io::InputIterator<Out, IndexT>(getFileManager()->getInputStream(getStorageFilePath(), 0));
    }